

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

void __thiscall
google::protobuf::UnknownFieldSet::DeleteSubrange(UnknownFieldSet *this,int start,int num)

{
  uint32 uVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  int in_EDX;
  int in_ESI;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *in_RDI;
  int i_2;
  int i_1;
  int i;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar5;
  int local_18;
  int local_14;
  
  for (local_14 = 0; local_14 < in_EDX; local_14 = local_14 + 1) {
    std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
    operator[](in_RDI,(long)(local_14 + in_ESI));
    UnknownField::Delete
              ((UnknownField *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  local_18 = in_ESI + in_EDX;
  while( true ) {
    sVar2 = std::
            vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            ::size(in_RDI);
    if (sVar2 <= (ulong)(long)local_18) break;
    pvVar3 = std::
             vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ::operator[](in_RDI,(long)local_18);
    pvVar4 = std::
             vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ::operator[](in_RDI,(long)(local_18 - in_EDX));
    uVar1 = pvVar3->type_;
    pvVar4->number_ = pvVar3->number_;
    pvVar4->type_ = uVar1;
    pvVar4->data_ = pvVar3->data_;
    local_18 = local_18 + 1;
  }
  for (iVar5 = 0; iVar5 < in_EDX; iVar5 = iVar5 + 1) {
    std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
    pop_back((vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
              *)0x469c47);
  }
  return;
}

Assistant:

void UnknownFieldSet::DeleteSubrange(int start, int num) {
  // Delete the specified fields.
  for (int i = 0; i < num; ++i) {
    (fields_)[i + start].Delete();
  }
  // Slide down the remaining fields.
  for (int i = start + num; i < fields_.size(); ++i) {
    (fields_)[i - num] = (fields_)[i];
  }
  // Pop off the # of deleted fields.
  for (int i = 0; i < num; ++i) {
    fields_.pop_back();
  }
}